

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vc.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  undefined1 uVar4;
  size_type sVar5;
  ostream *poVar6;
  uint uVar7;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_23;
  int t;
  int sequence_length;
  ostringstream error_message_22;
  ostringstream error_message_21;
  GaussianMixtureModelBasedConversion conversion;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  target_vectors;
  vector<double,_std::allocator<double>_> tmp;
  int read_size_1;
  istream *input_stream_1;
  ostringstream error_message_20;
  ifstream ifs_2;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  source_vectors;
  ostringstream error_message_19;
  vector<double,_std::allocator<double>_> variance;
  ostringstream error_message_18;
  ostringstream error_message_17;
  ostringstream error_message_16;
  int k;
  int read_size;
  istream *input_stream;
  ostringstream error_message_15;
  ifstream ifs_1;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> covariance_matrices;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  mean_vectors;
  vector<double,_std::allocator<double>_> weights;
  ostringstream error_message_14;
  ostringstream error_message_13;
  int num_input_files;
  char *input_file;
  char *gmm_file;
  ostringstream error_message_12;
  ostringstream error_message_11;
  vector<double,_std::allocator<double>_> coefficients_3;
  ostringstream error_message_10;
  vector<double,_std::allocator<double>_> coefficients_2;
  int n;
  ostringstream error_message_9;
  double coefficient_1;
  vector<double,_std::allocator<double>_> coefficients_1;
  ostringstream error_message_8;
  ifstream ifs;
  ostringstream error_message_7;
  ostringstream error_message_6;
  double coefficient;
  vector<double,_std::allocator<double>_> coefficients;
  ostringstream error_message_5;
  ostringstream error_message_4;
  ostringstream error_message_3;
  ostringstream error_message_2;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  option long_options [2];
  bool is_magic_number_specified;
  double magic_number;
  bool is_regression_specified;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  window_coefficients;
  bool full_covariance_flag;
  int num_mixture;
  bool is_num_target_order_specified;
  int num_target_order;
  int num_source_order;
  option *in_stack_ffffffffffffcb48;
  undefined4 in_stack_ffffffffffffcb50;
  undefined4 in_stack_ffffffffffffcb54;
  string *in_stack_ffffffffffffcb58;
  allocator *in_stack_ffffffffffffcb60;
  undefined4 in_stack_ffffffffffffcb68;
  int in_stack_ffffffffffffcb6c;
  SymmetricMatrix *in_stack_ffffffffffffcb70;
  allocator *paVar8;
  allocator *in_stack_ffffffffffffcb80;
  undefined6 in_stack_ffffffffffffcb88;
  undefined1 in_stack_ffffffffffffcb8e;
  undefined1 in_stack_ffffffffffffcb8f;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffcb90;
  int in_stack_ffffffffffffcb98;
  int in_stack_ffffffffffffcb9c;
  allocator *in_stack_ffffffffffffcba0;
  undefined7 in_stack_ffffffffffffcbb0;
  byte in_stack_ffffffffffffcbb7;
  undefined4 in_stack_ffffffffffffcbc0;
  undefined4 in_stack_ffffffffffffcbc4;
  istream *in_stack_ffffffffffffcbe0;
  undefined7 in_stack_ffffffffffffcbe8;
  undefined1 in_stack_ffffffffffffcbef;
  bool local_3331;
  byte local_3322;
  ostringstream *in_stack_ffffffffffffcd38;
  allocator *in_stack_ffffffffffffcd40;
  bool local_32b1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffcd78;
  undefined5 in_stack_ffffffffffffcd80;
  byte in_stack_ffffffffffffcd85;
  undefined1 in_stack_ffffffffffffcd86;
  undefined1 in_stack_ffffffffffffcd87;
  GaussianMixtureModelBasedConversion *in_stack_ffffffffffffcd88;
  bool local_3252;
  bool local_3232;
  bool local_320a;
  bool local_31ea;
  allocator local_31c9;
  string local_31c8 [32];
  ostringstream local_31a8 [216];
  double in_stack_ffffffffffffcf30;
  undefined1 in_stack_ffffffffffffcf3f;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffcf40;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffcf48;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffcf50;
  int in_stack_ffffffffffffcf58;
  int in_stack_ffffffffffffcf5c;
  GaussianMixtureModelBasedConversion *in_stack_ffffffffffffcf60;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *in_stack_ffffffffffffcf70;
  int local_302c;
  allocator local_3021;
  string local_3020 [32];
  ostringstream local_3000 [383];
  allocator local_2e81;
  string local_2e80 [32];
  ostringstream local_2e60 [376];
  GaussianMixtureModelBasedConversion local_2ce8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_2be0 [2];
  int local_2bac;
  vector<double,_std::allocator<double>_> *local_2ba8;
  allocator local_2b99;
  string local_2b98 [32];
  ostringstream local_2b78 [376];
  vector<double,_std::allocator<double>_> local_2a00 [22];
  allocator local_27d9;
  string local_27d8 [32];
  ostringstream local_27b8 [407];
  allocator local_2621;
  string local_2620 [32];
  ostringstream local_2600 [383];
  allocator local_2481;
  string local_2480 [32];
  ostringstream local_2460 [383];
  allocator local_22e1;
  string local_22e0 [32];
  ostringstream local_22c0 [376];
  int local_2148;
  int local_2144;
  char *local_2140;
  allocator local_2131;
  string local_2130 [32];
  ostringstream local_2110 [376];
  char local_1f98 [528];
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> local_1d88;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_1d68;
  vector<double,_std::allocator<double>_> local_1d48;
  allocator local_1d29;
  string local_1d28 [32];
  ostringstream local_1d08 [383];
  allocator local_1b89;
  string local_1b88 [32];
  ostringstream local_1b68 [380];
  int local_19ec;
  char *local_19e8;
  char *local_19e0;
  allocator local_19d1;
  string local_19d0 [32];
  ostringstream local_19b0 [383];
  allocator local_1831;
  string local_1830 [39];
  allocator local_1809;
  string local_1808 [32];
  ostringstream local_17e8 [405];
  byte local_1653;
  byte local_1652;
  allocator local_1651;
  string local_1650 [39];
  allocator local_1629;
  string local_1628 [32];
  ostringstream local_1608 [383];
  allocator local_1489;
  string local_1488 [63];
  allocator local_1449;
  string local_1448 [32];
  ostringstream local_1428 [415];
  allocator local_1289;
  string local_1288 [32];
  ostringstream local_1268 [376];
  char local_10f0 [527];
  allocator local_ee1;
  string local_ee0 [32];
  ostringstream local_ec0 [381];
  byte local_d43;
  byte local_d42;
  allocator local_d41;
  string local_d40 [39];
  allocator local_d19;
  string local_d18 [32];
  ostringstream local_cf8 [383];
  allocator local_b79;
  string local_b78 [71];
  allocator local_b31;
  string local_b30 [32];
  ostringstream local_b10 [383];
  allocator local_991;
  string local_990 [32];
  ostringstream local_970 [383];
  allocator local_7f1;
  string local_7f0 [39];
  allocator local_7c9;
  string local_7c8 [32];
  ostringstream local_7a8 [383];
  allocator local_629;
  string local_628 [39];
  allocator local_601;
  string local_600 [32];
  ostringstream local_5e0 [383];
  allocator local_461;
  string local_460 [39];
  allocator local_439;
  string local_438 [32];
  ostringstream local_418 [383];
  allocator local_299;
  string local_298 [32];
  int local_278;
  allocator local_271;
  string local_270 [32];
  ostringstream local_250 [383];
  allocator local_d1;
  string local_d0 [52];
  int local_9c;
  undefined1 local_98 [71];
  byte local_51;
  undefined8 local_50;
  byte local_41;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_40;
  byte local_21;
  int local_20;
  byte local_19;
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 0x19;
  local_18 = 0x19;
  local_19 = 0;
  local_20 = 0x10;
  local_21 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x103a0f);
  local_41 = 0;
  local_50 = 0;
  local_51 = 0;
  memcpy(local_98,&PTR_anon_var_dwarf_3831_00147940,0x40);
  do {
    while( true ) {
      local_9c = ya_getopt_long_only((int)((ulong)in_stack_ffffffffffffcb60 >> 0x20),
                                     (char **)in_stack_ffffffffffffcb58,
                                     (char *)CONCAT44(in_stack_ffffffffffffcb54,
                                                      in_stack_ffffffffffffcb50),
                                     in_stack_ffffffffffffcb48,(int *)0x103a6c);
      pcVar1 = ya_optarg;
      if (local_9c == -1) {
        if ((local_19 & 1) == 0) {
          local_18 = local_14;
        }
        local_19ec = local_8 - ya_optind;
        if (local_19ec == 2) {
          local_19e0 = *(char **)(local_10 + (long)(local_8 + -2) * 8);
          local_19e8 = *(char **)(local_10 + (long)(local_8 + -1) * 8);
        }
        else {
          if (local_19ec != 1) {
            std::__cxx11::ostringstream::ostringstream(local_1b68);
            std::operator<<((ostream *)local_1b68,
                            "Just two input files, gmmfile and infile, are required");
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1b88,"vc",&local_1b89);
            sptk::PrintErrorMessage((string *)in_stack_ffffffffffffcd40,in_stack_ffffffffffffcd38);
            std::__cxx11::string::~string(local_1b88);
            std::allocator<char>::~allocator((allocator<char> *)&local_1b89);
            local_4 = 1;
            local_278 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_1b68);
            goto LAB_00107039;
          }
          local_19e0 = *(char **)(local_10 + (long)(local_8 + -1) * 8);
          local_19e8 = (char *)0x0;
        }
        bVar2 = sptk::SetBinaryMode();
        if (bVar2) {
          std::allocator<double>::allocator((allocator<double> *)0x105d22);
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffcb70,
                     CONCAT44(in_stack_ffffffffffffcb6c,in_stack_ffffffffffffcb68),
                     (allocator_type *)in_stack_ffffffffffffcb60);
          std::allocator<double>::~allocator((allocator<double> *)0x105d4e);
          std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
                    ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x105d73);
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)in_stack_ffffffffffffcb70,
                   CONCAT44(in_stack_ffffffffffffcb6c,in_stack_ffffffffffffcb68),
                   (allocator_type *)in_stack_ffffffffffffcb60);
          std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
                    ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x105d9f);
          std::allocator<sptk::SymmetricMatrix>::allocator
                    ((allocator<sptk::SymmetricMatrix> *)0x105dc4);
          std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::vector
                    ((vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
                     in_stack_ffffffffffffcb70,
                     CONCAT44(in_stack_ffffffffffffcb6c,in_stack_ffffffffffffcb68),
                     (allocator_type *)in_stack_ffffffffffffcb60);
          std::allocator<sptk::SymmetricMatrix>::~allocator
                    ((allocator<sptk::SymmetricMatrix> *)0x105df0);
          std::ifstream::ifstream(local_1f98);
          pcVar1 = local_19e0;
          std::operator|(_S_in,_S_bin);
          std::ifstream::open(local_1f98,(_Ios_Openmode)pcVar1);
          bVar3 = std::ios::fail();
          if ((bVar3 & 1) != 0) {
            std::__cxx11::ostringstream::ostringstream(local_2110);
            poVar6 = std::operator<<((ostream *)local_2110,"Cannot open file ");
            std::operator<<(poVar6,local_19e0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_2130,"vc",&local_2131);
            sptk::PrintErrorMessage((string *)in_stack_ffffffffffffcd40,in_stack_ffffffffffffcd38);
            std::__cxx11::string::~string(local_2130);
            std::allocator<char>::~allocator((allocator<char> *)&local_2131);
            local_4 = 1;
            local_278 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_2110);
            goto LAB_00106735;
          }
          local_2140 = local_1f98;
          sVar5 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::size(&local_40);
          local_2144 = ((int)sVar5 + 1) * (local_14 + local_18 + 2);
          local_2148 = 0;
          goto LAB_0010609e;
        }
        std::__cxx11::ostringstream::ostringstream(local_1d08);
        std::operator<<((ostream *)local_1d08,"Cannot set translation mode");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1d28,"vc",&local_1d29);
        sptk::PrintErrorMessage((string *)in_stack_ffffffffffffcd40,in_stack_ffffffffffffcd38);
        std::__cxx11::string::~string(local_1d28);
        std::allocator<char>::~allocator((allocator<char> *)&local_1d29);
        local_4 = 1;
        local_278 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1d08);
        goto LAB_00107039;
      }
      if (local_9c == 0x44) break;
      if (local_9c == 0x4c) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_460,pcVar1,&local_461);
        bVar2 = sptk::ConvertStringToInteger
                          (in_stack_ffffffffffffcb58,
                           (int *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50));
        local_3232 = !bVar2 || local_18 < 1;
        std::__cxx11::string::~string(local_460);
        std::allocator<char>::~allocator((allocator<char> *)&local_461);
        if (local_3232) {
          std::__cxx11::ostringstream::ostringstream(local_5e0);
          std::operator<<((ostream *)local_5e0,
                          "The argument for the -L option must be a positive integer");
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_600,"vc",&local_601);
          sptk::PrintErrorMessage((string *)in_stack_ffffffffffffcd40,in_stack_ffffffffffffcd38);
          std::__cxx11::string::~string(local_600);
          std::allocator<char>::~allocator((allocator<char> *)&local_601);
          local_4 = 1;
          local_278 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_5e0);
          goto LAB_00107039;
        }
        local_18 = local_18 + -1;
        local_19 = 1;
      }
      else if (local_9c == 0x4d) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_628,pcVar1,&local_629);
        bVar2 = sptk::ConvertStringToInteger
                          (in_stack_ffffffffffffcb58,
                           (int *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50));
        local_3252 = !bVar2 || local_18 < 0;
        std::__cxx11::string::~string(local_628);
        std::allocator<char>::~allocator((allocator<char> *)&local_629);
        if (local_3252) {
          std::__cxx11::ostringstream::ostringstream(local_7a8);
          poVar6 = std::operator<<((ostream *)local_7a8,"The argument for the -M option must be a ")
          ;
          std::operator<<(poVar6,"non-negative integer");
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_7c8,"vc",&local_7c9);
          sptk::PrintErrorMessage((string *)in_stack_ffffffffffffcd40,in_stack_ffffffffffffcd38);
          std::__cxx11::string::~string(local_7c8);
          std::allocator<char>::~allocator((allocator<char> *)&local_7c9);
          local_4 = 1;
          local_278 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_7a8);
          goto LAB_00107039;
        }
        local_19 = 1;
      }
      else if (local_9c == 100) {
        if ((local_41 & 1) != 0) {
          std::__cxx11::ostringstream::ostringstream(local_b10);
          std::operator<<((ostream *)local_b10,
                          "-d and -r options cannot be specified at the same time");
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_b30,"vc",&local_b31);
          sptk::PrintErrorMessage((string *)in_stack_ffffffffffffcd40,in_stack_ffffffffffffcd38);
          std::__cxx11::string::~string(local_b30);
          std::allocator<char>::~allocator((allocator<char> *)&local_b31);
          local_4 = 1;
          local_278 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_b10);
          goto LAB_00107039;
        }
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)0x104820);
        pcVar1 = ya_optarg;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b78,pcVar1,&local_b79);
        bVar2 = sptk::ConvertStringToDouble
                          (in_stack_ffffffffffffcb58,
                           (double *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50));
        std::__cxx11::string::~string(local_b78);
        std::allocator<char>::~allocator((allocator<char> *)&local_b79);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffcb60,
                     (value_type *)in_stack_ffffffffffffcb58);
          while( true ) {
            local_d42 = 0;
            local_d43 = 0;
            local_32b1 = false;
            if (ya_optind < local_8) {
              in_stack_ffffffffffffcd38 = *(ostringstream **)(local_10 + (long)ya_optind * 8);
              in_stack_ffffffffffffcd40 = &local_d41;
              std::allocator<char>::allocator();
              local_d42 = 1;
              std::__cxx11::string::string
                        (local_d40,(char *)in_stack_ffffffffffffcd38,in_stack_ffffffffffffcd40);
              local_d43 = 1;
              local_32b1 = sptk::ConvertStringToDouble
                                     (in_stack_ffffffffffffcb58,
                                      (double *)
                                      CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50))
              ;
            }
            if ((local_d43 & 1) != 0) {
              std::__cxx11::string::~string(local_d40);
            }
            if ((local_d42 & 1) != 0) {
              std::allocator<char>::~allocator((allocator<char> *)&local_d41);
            }
            if (local_32b1 == false) break;
            std::vector<double,_std::allocator<double>_>::push_back
                      ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffcb60,
                       (value_type *)in_stack_ffffffffffffcb58);
            ya_optind = ya_optind + 1;
          }
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)in_stack_ffffffffffffcb60,(value_type *)in_stack_ffffffffffffcb58);
          local_278 = 4;
        }
        else {
          std::__cxx11::ostringstream::ostringstream(local_cf8);
          std::operator<<((ostream *)local_cf8,"The argument for the -d option must be numeric");
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_d18,"vc",&local_d19);
          sptk::PrintErrorMessage((string *)in_stack_ffffffffffffcd40,in_stack_ffffffffffffcd38);
          std::__cxx11::string::~string(local_d18);
          std::allocator<char>::~allocator((allocator<char> *)&local_d19);
          local_4 = 1;
          local_278 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_cf8);
        }
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffcb60);
        if (local_278 != 4) goto LAB_00107039;
      }
      else if (local_9c == 0x66) {
        local_21 = 1;
      }
      else {
        if (local_9c == 0x68) {
          anon_unknown.dwarf_37e6::PrintUsage
                    ((ostream *)CONCAT44(in_stack_ffffffffffffcbc4,in_stack_ffffffffffffcbc0));
          local_4 = 0;
          local_278 = 1;
          goto LAB_00107039;
        }
        if (local_9c == 0x6b) {
          in_stack_ffffffffffffcd88 = (GaussianMixtureModelBasedConversion *)ya_optarg;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_7f0,(char *)in_stack_ffffffffffffcd88,&local_7f1);
          in_stack_ffffffffffffcd87 =
               sptk::ConvertStringToInteger
                         (in_stack_ffffffffffffcb58,
                          (int *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50));
          in_stack_ffffffffffffcd85 = !(bool)in_stack_ffffffffffffcd87 || local_20 < 1;
          in_stack_ffffffffffffcd86 = in_stack_ffffffffffffcd85;
          std::__cxx11::string::~string(local_7f0);
          std::allocator<char>::~allocator((allocator<char> *)&local_7f1);
          if ((in_stack_ffffffffffffcd85 & 1) != 0) {
            std::__cxx11::ostringstream::ostringstream(local_970);
            std::operator<<((ostream *)local_970,
                            "The argument for the -k option must be a positive integer");
            paVar8 = &local_991;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_990,"vc",paVar8);
            sptk::PrintErrorMessage((string *)in_stack_ffffffffffffcd40,in_stack_ffffffffffffcd38);
            std::__cxx11::string::~string(local_990);
            std::allocator<char>::~allocator((allocator<char> *)&local_991);
            local_4 = 1;
            local_278 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_970);
            goto LAB_00107039;
          }
        }
        else if (local_9c == 0x6c) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_d0,pcVar1,&local_d1);
          bVar2 = sptk::ConvertStringToInteger
                            (in_stack_ffffffffffffcb58,
                             (int *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50));
          local_31ea = !bVar2 || local_14 < 1;
          std::__cxx11::string::~string(local_d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_d1);
          if (local_31ea) {
            std::__cxx11::ostringstream::ostringstream(local_250);
            std::operator<<((ostream *)local_250,
                            "The argument for the -l option must be a positive integer");
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_270,"vc",&local_271);
            sptk::PrintErrorMessage((string *)in_stack_ffffffffffffcd40,in_stack_ffffffffffffcd38);
            std::__cxx11::string::~string(local_270);
            std::allocator<char>::~allocator((allocator<char> *)&local_271);
            local_4 = 1;
            local_278 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_250);
            goto LAB_00107039;
          }
          local_14 = local_14 + -1;
        }
        else if (local_9c == 0x6d) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_298,pcVar1,&local_299);
          bVar2 = sptk::ConvertStringToInteger
                            (in_stack_ffffffffffffcb58,
                             (int *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50));
          local_320a = !bVar2 || local_14 < 0;
          std::__cxx11::string::~string(local_298);
          std::allocator<char>::~allocator((allocator<char> *)&local_299);
          if (local_320a) {
            std::__cxx11::ostringstream::ostringstream(local_418);
            poVar6 = std::operator<<((ostream *)local_418,
                                     "The argument for the -m option must be a ");
            std::operator<<(poVar6,"non-negative integer");
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_438,"vc",&local_439);
            sptk::PrintErrorMessage((string *)in_stack_ffffffffffffcd40,in_stack_ffffffffffffcd38);
            std::__cxx11::string::~string(local_438);
            std::allocator<char>::~allocator((allocator<char> *)&local_439);
            local_4 = 1;
            local_278 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_418);
            goto LAB_00107039;
          }
        }
        else if (local_9c == 0x72) {
          if ((local_41 & 1) != 0) {
            std::__cxx11::ostringstream::ostringstream(local_1428);
            std::operator<<((ostream *)local_1428,"-r option cannot be specified multiple times");
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1448,"vc",&local_1449);
            sptk::PrintErrorMessage((string *)in_stack_ffffffffffffcd40,in_stack_ffffffffffffcd38);
            std::__cxx11::string::~string(local_1448);
            std::allocator<char>::~allocator((allocator<char> *)&local_1449);
            local_4 = 1;
            local_278 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_1428);
            goto LAB_00107039;
          }
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)0x105168);
          pcVar1 = ya_optarg;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1488,pcVar1,&local_1489);
          bVar2 = sptk::ConvertStringToInteger
                            (in_stack_ffffffffffffcb58,
                             (int *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50));
          local_3322 = 1;
          if (bVar2) {
            bVar2 = sptk::ComputeFirstOrderRegressionCoefficients
                              ((int)in_stack_ffffffffffffcb70,
                               (vector<double,_std::allocator<double>_> *)
                               CONCAT44(in_stack_ffffffffffffcb6c,in_stack_ffffffffffffcb68));
            local_3322 = bVar2 ^ 0xff;
          }
          std::__cxx11::string::~string(local_1488);
          std::allocator<char>::~allocator((allocator<char> *)&local_1489);
          if ((local_3322 & 1) == 0) {
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)in_stack_ffffffffffffcb60,(value_type *)in_stack_ffffffffffffcb58);
            local_278 = 0;
          }
          else {
            std::__cxx11::ostringstream::ostringstream(local_1608);
            std::operator<<((ostream *)local_1608,
                            "The argument for the -r option must be positive integer(s)");
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1628,"vc",&local_1629);
            sptk::PrintErrorMessage((string *)in_stack_ffffffffffffcd40,in_stack_ffffffffffffcd38);
            std::__cxx11::string::~string(local_1628);
            std::allocator<char>::~allocator((allocator<char> *)&local_1629);
            local_4 = 1;
            local_278 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_1608);
          }
          std::vector<double,_std::allocator<double>_>::~vector
                    ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffcb60);
          if (local_278 != 0) goto LAB_00107039;
          local_1652 = 0;
          local_1653 = 0;
          local_3331 = false;
          if (ya_optind < local_8) {
            pcVar1 = *(char **)(local_10 + (long)ya_optind * 8);
            std::allocator<char>::allocator();
            local_1652 = 1;
            std::__cxx11::string::string(local_1650,pcVar1,&local_1651);
            local_1653 = 1;
            local_3331 = sptk::ConvertStringToInteger
                                   (in_stack_ffffffffffffcb58,
                                    (int *)CONCAT44(in_stack_ffffffffffffcb54,
                                                    in_stack_ffffffffffffcb50));
          }
          if ((local_1653 & 1) != 0) {
            std::__cxx11::string::~string(local_1650);
          }
          if ((local_1652 & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)&local_1651);
          }
          if (local_3331 != false) {
            std::vector<double,_std::allocator<double>_>::vector
                      ((vector<double,_std::allocator<double>_> *)0x10552d);
            bVar2 = sptk::ComputeSecondOrderRegressionCoefficients
                              ((int)in_stack_ffffffffffffcb70,
                               (vector<double,_std::allocator<double>_> *)
                               CONCAT44(in_stack_ffffffffffffcb6c,in_stack_ffffffffffffcb68));
            if (bVar2) {
              std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)in_stack_ffffffffffffcb60,(value_type *)in_stack_ffffffffffffcb58);
              ya_optind = ya_optind + 1;
              local_278 = 0;
            }
            else {
              std::__cxx11::ostringstream::ostringstream(local_17e8);
              std::operator<<((ostream *)local_17e8,
                              "The argument for the -r option must be positive integer(s)");
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_1808,"vc",&local_1809);
              sptk::PrintErrorMessage((string *)in_stack_ffffffffffffcd40,in_stack_ffffffffffffcd38)
              ;
              std::__cxx11::string::~string(local_1808);
              std::allocator<char>::~allocator((allocator<char> *)&local_1809);
              local_4 = 1;
              local_278 = 1;
              std::__cxx11::ostringstream::~ostringstream(local_17e8);
            }
            std::vector<double,_std::allocator<double>_>::~vector
                      ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffcb60);
            if (local_278 != 0) goto LAB_00107039;
          }
          local_41 = 1;
        }
        else {
          if (local_9c != 1000) {
            anon_unknown.dwarf_37e6::PrintUsage
                      ((ostream *)CONCAT44(in_stack_ffffffffffffcbc4,in_stack_ffffffffffffcbc0));
            local_4 = 1;
            local_278 = 1;
            goto LAB_00107039;
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1830,pcVar1,&local_1831);
          bVar2 = sptk::ConvertStringToDouble
                            (in_stack_ffffffffffffcb58,
                             (double *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50)
                            );
          std::__cxx11::string::~string(local_1830);
          std::allocator<char>::~allocator((allocator<char> *)&local_1831);
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            std::__cxx11::ostringstream::ostringstream(local_19b0);
            std::operator<<((ostream *)local_19b0,
                            "The argument for the -magic option must be a number");
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_19d0,"vc",&local_19d1);
            sptk::PrintErrorMessage((string *)in_stack_ffffffffffffcd40,in_stack_ffffffffffffcd38);
            std::__cxx11::string::~string(local_19d0);
            std::allocator<char>::~allocator((allocator<char> *)&local_19d1);
            local_4 = 1;
            local_278 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_19b0);
            goto LAB_00107039;
          }
          local_51 = 1;
        }
      }
    }
    if ((local_41 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_ec0);
      std::operator<<((ostream *)local_ec0,"-D and -r options cannot be specified at the same time")
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ee0,"vc",&local_ee1);
      sptk::PrintErrorMessage((string *)in_stack_ffffffffffffcd40,in_stack_ffffffffffffcd38);
      std::__cxx11::string::~string(local_ee0);
      std::allocator<char>::~allocator((allocator<char> *)&local_ee1);
      local_4 = 1;
      local_278 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_ec0);
      break;
    }
    std::ifstream::ifstream(local_10f0);
    pcVar1 = ya_optarg;
    std::operator|(_S_in,_S_bin);
    std::ifstream::open(local_10f0,(_Ios_Openmode)pcVar1);
    bVar3 = std::ios::fail();
    if ((bVar3 & 1) == 0) {
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)0x104f66);
      while (bVar2 = sptk::ReadStream<double>
                               ((double *)in_stack_ffffffffffffcb58,
                                (istream *)
                                CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50)),
            bVar2) {
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffcb60,
                   (value_type *)in_stack_ffffffffffffcb58);
      }
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)in_stack_ffffffffffffcb60,(value_type *)in_stack_ffffffffffffcb58);
      local_278 = 4;
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffcb60);
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1268);
      poVar6 = std::operator<<((ostream *)local_1268,"Cannot open file ");
      std::operator<<(poVar6,ya_optarg);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1288,"vc",&local_1289);
      sptk::PrintErrorMessage((string *)in_stack_ffffffffffffcd40,in_stack_ffffffffffffcd38);
      std::__cxx11::string::~string(local_1288);
      std::allocator<char>::~allocator((allocator<char> *)&local_1289);
      local_4 = 1;
      local_278 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1268);
    }
    std::ifstream::~ifstream(local_10f0);
  } while (local_278 == 4);
  goto LAB_00107039;
LAB_0010609e:
  if (local_20 <= local_2148) goto LAB_0010672a;
  std::vector<double,_std::allocator<double>_>::operator[](&local_1d48,(long)local_2148);
  bVar2 = sptk::ReadStream<double>
                    ((double *)in_stack_ffffffffffffcb58,
                     (istream *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50));
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_22c0);
    std::operator<<((ostream *)local_22c0,"Failed to load mixture weight");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_22e0,"vc",&local_22e1);
    sptk::PrintErrorMessage((string *)in_stack_ffffffffffffcd40,in_stack_ffffffffffffcd38);
    std::__cxx11::string::~string(local_22e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_22e1);
    local_4 = 1;
    local_278 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_22c0);
    goto LAB_00106735;
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator[](&local_1d68,(long)local_2148);
  bVar2 = sptk::ReadStream<double>
                    (SUB81((ulong)in_stack_ffffffffffffcba0 >> 0x30,0),
                     (int)in_stack_ffffffffffffcba0,in_stack_ffffffffffffcb9c,
                     in_stack_ffffffffffffcb98,in_stack_ffffffffffffcb90,
                     (istream *)
                     CONCAT17(in_stack_ffffffffffffcb8f,
                              CONCAT16(in_stack_ffffffffffffcb8e,in_stack_ffffffffffffcb88)),
                     (int *)CONCAT17(in_stack_ffffffffffffcbb7,in_stack_ffffffffffffcbb0));
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_2460);
    std::operator<<((ostream *)local_2460,"Failed to load mean vector");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2480,"vc",&local_2481);
    sptk::PrintErrorMessage((string *)in_stack_ffffffffffffcd40,in_stack_ffffffffffffcd38);
    std::__cxx11::string::~string(local_2480);
    std::allocator<char>::~allocator((allocator<char> *)&local_2481);
    local_4 = 1;
    local_278 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_2460);
    goto LAB_00106735;
  }
  std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::operator[]
            (&local_1d88,(long)local_2148);
  sptk::SymmetricMatrix::Resize(in_stack_ffffffffffffcb70,in_stack_ffffffffffffcb6c);
  if ((local_21 & 1) == 0) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x106539);
    bVar2 = sptk::ReadStream<double>
                      (SUB81((ulong)in_stack_ffffffffffffcba0 >> 0x30,0),
                       (int)in_stack_ffffffffffffcba0,in_stack_ffffffffffffcb9c,
                       in_stack_ffffffffffffcb98,in_stack_ffffffffffffcb90,
                       (istream *)
                       CONCAT17(in_stack_ffffffffffffcb8f,
                                CONCAT16(in_stack_ffffffffffffcb8e,in_stack_ffffffffffffcb88)),
                       (int *)CONCAT17(in_stack_ffffffffffffcbb7,in_stack_ffffffffffffcbb0));
    if (bVar2) {
      std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::operator[]
                (&local_1d88,(long)local_2148);
      sptk::SymmetricMatrix::SetDiagonal
                ((SymmetricMatrix *)CONCAT44(in_stack_ffffffffffffcb6c,in_stack_ffffffffffffcb68),
                 (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffcb60);
      local_278 = 0;
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_27b8);
      std::operator<<((ostream *)local_27b8,"Failed to load diagonal covariance vector");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_27d8,"vc",&local_27d9);
      sptk::PrintErrorMessage((string *)in_stack_ffffffffffffcd40,in_stack_ffffffffffffcd38);
      std::__cxx11::string::~string(local_27d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_27d9);
      local_4 = 1;
      local_278 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_27b8);
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffcb60);
    if (local_278 != 0) goto LAB_00106735;
  }
  else {
    std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::operator[]
              (&local_1d88,(long)local_2148);
    in_stack_ffffffffffffcbef =
         sptk::ReadStream((SymmetricMatrix *)
                          CONCAT17(in_stack_ffffffffffffcbef,in_stack_ffffffffffffcbe8),
                          in_stack_ffffffffffffcbe0);
    if (!(bool)in_stack_ffffffffffffcbef) {
      std::__cxx11::ostringstream::ostringstream(local_2600);
      std::operator<<((ostream *)local_2600,"Failed to load covariance matrix");
      paVar8 = &local_2621;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2620,"vc",paVar8);
      sptk::PrintErrorMessage((string *)in_stack_ffffffffffffcd40,in_stack_ffffffffffffcd38);
      std::__cxx11::string::~string(local_2620);
      std::allocator<char>::~allocator((allocator<char> *)&local_2621);
      local_4 = 1;
      local_278 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_2600);
      goto LAB_00106735;
    }
  }
  local_2148 = local_2148 + 1;
  goto LAB_0010609e;
LAB_0010672a:
  local_278 = 0;
LAB_00106735:
  std::ifstream::~ifstream(local_1f98);
  if (local_278 == 0) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)0x106760);
    std::ifstream::ifstream(local_2a00);
    pcVar1 = local_19e8;
    if (local_19e8 == (char *)0x0) {
LAB_0010695b:
      bVar3 = std::ifstream::is_open();
      in_stack_ffffffffffffcb9c = CONCAT13(bVar3,(int3)in_stack_ffffffffffffcb9c);
      if ((bVar3 & 1) == 0) {
        in_stack_ffffffffffffcb90 = (vector<double,_std::allocator<double>_> *)&std::cin;
      }
      else {
        in_stack_ffffffffffffcb90 = local_2a00;
      }
      local_2ba8 = in_stack_ffffffffffffcb90;
      sVar5 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::size(&local_40);
      local_2bac = ((int)sVar5 + 1) * (local_14 + 1);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)0x1069d4);
      while (in_stack_ffffffffffffcb8f =
                  sptk::ReadStream<double>
                            (SUB81((ulong)in_stack_ffffffffffffcba0 >> 0x30,0),
                             (int)in_stack_ffffffffffffcba0,in_stack_ffffffffffffcb9c,
                             in_stack_ffffffffffffcb98,in_stack_ffffffffffffcb90,
                             (istream *)
                             CONCAT17(in_stack_ffffffffffffcb8f,
                                      CONCAT16(in_stack_ffffffffffffcb8e,in_stack_ffffffffffffcb88))
                             ,(int *)CONCAT17(in_stack_ffffffffffffcbb7,in_stack_ffffffffffffcbb0)),
            (bool)in_stack_ffffffffffffcb8f) {
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     *)in_stack_ffffffffffffcb60,(value_type *)in_stack_ffffffffffffcb58);
      }
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffcb60);
      local_278 = 0;
    }
    else {
      std::operator|(_S_in,_S_bin);
      std::ifstream::open((char *)local_2a00,(_Ios_Openmode)pcVar1);
      in_stack_ffffffffffffcbb7 = std::ios::fail();
      if ((in_stack_ffffffffffffcbb7 & 1) == 0) goto LAB_0010695b;
      std::__cxx11::ostringstream::ostringstream(local_2b78);
      poVar6 = std::operator<<((ostream *)local_2b78,"Cannot open file ");
      std::operator<<(poVar6,local_19e8);
      in_stack_ffffffffffffcba0 = &local_2b99;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2b98,"vc",in_stack_ffffffffffffcba0);
      sptk::PrintErrorMessage((string *)in_stack_ffffffffffffcd40,in_stack_ffffffffffffcd38);
      std::__cxx11::string::~string(local_2b98);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b99);
      local_4 = 1;
      local_278 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_2b78);
    }
    std::ifstream::~ifstream(local_2a00);
    if (local_278 == 0) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)0x106a92);
      uVar7 = local_51 & 1;
      sptk::GaussianMixtureModelBasedConversion::GaussianMixtureModelBasedConversion
                (in_stack_ffffffffffffcf60,in_stack_ffffffffffffcf5c,in_stack_ffffffffffffcf58,
                 in_stack_ffffffffffffcf50,in_stack_ffffffffffffcf48,in_stack_ffffffffffffcf40,
                 in_stack_ffffffffffffcf70,(bool)in_stack_ffffffffffffcf3f,in_stack_ffffffffffffcf30
                );
      uVar4 = sptk::GaussianMixtureModelBasedConversion::IsValid(&local_2ce8);
      if ((bool)uVar4) {
        bVar2 = sptk::GaussianMixtureModelBasedConversion::Run
                          (in_stack_ffffffffffffcd88,
                           (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)CONCAT17(in_stack_ffffffffffffcd87,
                                       CONCAT16(in_stack_ffffffffffffcd86,
                                                CONCAT15(in_stack_ffffffffffffcd85,
                                                         in_stack_ffffffffffffcd80))),
                           in_stack_ffffffffffffcd78);
        if (bVar2) {
          local_278 = 0;
        }
        else {
          std::__cxx11::ostringstream::ostringstream(local_3000);
          std::operator<<((ostream *)local_3000,"Failed to perform voice conversion");
          paVar8 = &local_3021;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_3020,"vc",paVar8);
          sptk::PrintErrorMessage((string *)in_stack_ffffffffffffcd40,in_stack_ffffffffffffcd38);
          std::__cxx11::string::~string(local_3020);
          std::allocator<char>::~allocator((allocator<char> *)&local_3021);
          local_4 = 1;
          local_278 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_3000);
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_2e60);
        std::operator<<((ostream *)local_2e60,
                        "Failed to initialize GaussianMixtureModelBasedConversion");
        in_stack_ffffffffffffcb80 = &local_2e81;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2e80,"vc",in_stack_ffffffffffffcb80);
        sptk::PrintErrorMessage((string *)in_stack_ffffffffffffcd40,in_stack_ffffffffffffcd38);
        std::__cxx11::string::~string(local_2e80);
        std::allocator<char>::~allocator((allocator<char> *)&local_2e81);
        local_4 = 1;
        local_278 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_2e60);
      }
      sptk::GaussianMixtureModelBasedConversion::~GaussianMixtureModelBasedConversion
                ((GaussianMixtureModelBasedConversion *)CONCAT44(in_stack_ffffffffffffcb54,uVar7));
      if (local_278 == 0) {
        sVar5 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::size(local_2be0);
        for (local_302c = 0; local_302c < (int)sVar5; local_302c = local_302c + 1) {
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::operator[](local_2be0,(long)local_302c);
          bVar2 = sptk::WriteStream<double>
                            ((int)in_stack_ffffffffffffcba0,in_stack_ffffffffffffcb9c,
                             in_stack_ffffffffffffcb90,
                             (ostream *)
                             CONCAT17(in_stack_ffffffffffffcb8f,
                                      CONCAT16(uVar4,in_stack_ffffffffffffcb88)),
                             (int *)in_stack_ffffffffffffcb80);
          if (!bVar2) {
            std::__cxx11::ostringstream::ostringstream(local_31a8);
            std::operator<<((ostream *)local_31a8,"Failed to write target vectors");
            in_stack_ffffffffffffcb60 = &local_31c9;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_31c8,"vc",in_stack_ffffffffffffcb60);
            sptk::PrintErrorMessage((string *)in_stack_ffffffffffffcd40,in_stack_ffffffffffffcd38);
            std::__cxx11::string::~string(local_31c8);
            std::allocator<char>::~allocator((allocator<char> *)&local_31c9);
            local_4 = 1;
            local_278 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_31a8);
            goto LAB_00106fab;
          }
        }
        local_4 = 0;
        local_278 = 1;
      }
LAB_00106fab:
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)in_stack_ffffffffffffcb60);
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)in_stack_ffffffffffffcb60);
  }
  std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::~vector
            ((vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
             in_stack_ffffffffffffcb60);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)in_stack_ffffffffffffcb60);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffcb60);
LAB_00107039:
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)in_stack_ffffffffffffcb60);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_source_order(kDefaultNumOrder);
  int num_target_order(kDefaultNumOrder);
  bool is_num_target_order_specified(false);
  int num_mixture(kDefaultNumMixture);
  bool full_covariance_flag(kDefaultFullCovarianceFlag);
  std::vector<std::vector<double> > window_coefficients;
  bool is_regression_specified(false);
  double magic_number(0.0);
  bool is_magic_number_specified(false);

  const struct option long_options[] = {
      {"magic", required_argument, NULL, kMagic},
      {0, 0, 0, 0},
  };

  for (;;) {
    const int option_char(
        getopt_long_only(argc, argv, "l:m:L:M:k:fd:D:r:h", long_options, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &num_source_order) ||
            num_source_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
        --num_source_order;
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_source_order) ||
            num_source_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
        break;
      }
      case 'L': {
        if (!sptk::ConvertStringToInteger(optarg, &num_target_order) ||
            num_target_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -L option must be a positive integer";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
        --num_target_order;
        is_num_target_order_specified = true;
        break;
      }
      case 'M': {
        if (!sptk::ConvertStringToInteger(optarg, &num_target_order) ||
            num_target_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -M option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
        is_num_target_order_specified = true;
        break;
      }
      case 'k': {
        if (!sptk::ConvertStringToInteger(optarg, &num_mixture) ||
            num_mixture <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -k option must be a positive integer";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
        break;
      }
      case 'f': {
        full_covariance_flag = true;
        break;
      }
      case 'd': {
        if (is_regression_specified) {
          std::ostringstream error_message;
          error_message
              << "-d and -r options cannot be specified at the same time";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }

        std::vector<double> coefficients;
        double coefficient;
        if (!sptk::ConvertStringToDouble(optarg, &coefficient)) {
          std::ostringstream error_message;
          error_message << "The argument for the -d option must be numeric";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
        coefficients.push_back(coefficient);
        while (optind < argc &&
               sptk::ConvertStringToDouble(argv[optind], &coefficient)) {
          coefficients.push_back(coefficient);
          ++optind;
        }
        window_coefficients.push_back(coefficients);
        break;
      }
      case 'D': {
        if (is_regression_specified) {
          std::ostringstream error_message;
          error_message
              << "-D and -r options cannot be specified at the same time";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }

        std::ifstream ifs;
        ifs.open(optarg, std::ios::in | std::ios::binary);
        if (ifs.fail()) {
          std::ostringstream error_message;
          error_message << "Cannot open file " << optarg;
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
        std::vector<double> coefficients;
        double coefficient;
        while (sptk::ReadStream(&coefficient, &ifs)) {
          coefficients.push_back(coefficient);
        }
        window_coefficients.push_back(coefficients);
        break;
      }
      case 'r': {
        if (is_regression_specified) {
          std::ostringstream error_message;
          error_message << "-r option cannot be specified multiple times";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }

        int n;
        // Set first order coefficients.
        {
          std::vector<double> coefficients;
          if (!sptk::ConvertStringToInteger(optarg, &n) ||
              !sptk::ComputeFirstOrderRegressionCoefficients(n,
                                                             &coefficients)) {
            std::ostringstream error_message;
            error_message
                << "The argument for the -r option must be positive integer(s)";
            sptk::PrintErrorMessage("vc", error_message);
            return 1;
          }
          window_coefficients.push_back(coefficients);
        }

        // Set second order coefficients.
        if (optind < argc && sptk::ConvertStringToInteger(argv[optind], &n)) {
          std::vector<double> coefficients;
          if (!sptk::ComputeSecondOrderRegressionCoefficients(n,
                                                              &coefficients)) {
            std::ostringstream error_message;
            error_message
                << "The argument for the -r option must be positive integer(s)";
            sptk::PrintErrorMessage("vc", error_message);
            return 1;
          }
          window_coefficients.push_back(coefficients);
          ++optind;
        }
        is_regression_specified = true;
        break;
      }
      case kMagic: {
        if (!sptk::ConvertStringToDouble(optarg, &magic_number)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -magic option must be a number";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
        is_magic_number_specified = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (!is_num_target_order_specified) {
    num_target_order = num_source_order;
  }

  // Get input file names.
  const char* gmm_file;
  const char* input_file;
  const int num_input_files(argc - optind);
  if (2 == num_input_files) {
    gmm_file = argv[argc - 2];
    input_file = argv[argc - 1];
  } else if (1 == num_input_files) {
    gmm_file = argv[argc - 1];
    input_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Just two input files, gmmfile and infile, are required";
    sptk::PrintErrorMessage("vc", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("vc", error_message);
    return 1;
  }

  // Load GMM.
  std::vector<double> weights(num_mixture);
  std::vector<std::vector<double> > mean_vectors(num_mixture);
  std::vector<sptk::SymmetricMatrix> covariance_matrices(num_mixture);
  {
    std::ifstream ifs;
    ifs.open(gmm_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << gmm_file;
      sptk::PrintErrorMessage("vc", error_message);
      return 1;
    }
    std::istream& input_stream(ifs);

    const int read_size(static_cast<int>(window_coefficients.size() + 1) *
                        (num_source_order + num_target_order + 2));
    for (int k(0); k < num_mixture; ++k) {
      if (!sptk::ReadStream(&(weights[k]), &input_stream)) {
        std::ostringstream error_message;
        error_message << "Failed to load mixture weight";
        sptk::PrintErrorMessage("vc", error_message);
        return 1;
      }

      if (!sptk::ReadStream(false, 0, 0, read_size, &mean_vectors[k],
                            &input_stream, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to load mean vector";
        sptk::PrintErrorMessage("vc", error_message);
        return 1;
      }

      covariance_matrices[k].Resize(read_size);
      if (full_covariance_flag) {
        if (!sptk::ReadStream(&covariance_matrices[k], &input_stream)) {
          std::ostringstream error_message;
          error_message << "Failed to load covariance matrix";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
      } else {
        std::vector<double> variance;
        if (!sptk::ReadStream(false, 0, 0, read_size, &variance, &input_stream,
                              NULL)) {
          std::ostringstream error_message;
          error_message << "Failed to load diagonal covariance vector";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
        covariance_matrices[k].SetDiagonal(variance);
      }
    }
  }

  // Read input vectors.
  std::vector<std::vector<double> > source_vectors;
  {
    std::ifstream ifs;
    if (NULL != input_file) {
      ifs.open(input_file, std::ios::in | std::ios::binary);
      if (ifs.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << input_file;
        sptk::PrintErrorMessage("vc", error_message);
        return 1;
      }
    }
    std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

    const int read_size(static_cast<int>(window_coefficients.size() + 1) *
                        (num_source_order + 1));
    std::vector<double> tmp;
    while (
        sptk::ReadStream(false, 0, 0, read_size, &tmp, &input_stream, NULL)) {
      source_vectors.push_back(tmp);
    }
  }

  // Perform voice conversion.
  std::vector<std::vector<double> > target_vectors;
  {
    sptk::GaussianMixtureModelBasedConversion conversion(
        num_source_order, num_target_order, window_coefficients, weights,
        mean_vectors, covariance_matrices, is_magic_number_specified,
        magic_number);
    if (!conversion.IsValid()) {
      std::ostringstream error_message;
      error_message
          << "Failed to initialize GaussianMixtureModelBasedConversion";
      sptk::PrintErrorMessage("vc", error_message);
      return 1;
    }
    if (!conversion.Run(source_vectors, &target_vectors)) {
      std::ostringstream error_message;
      error_message << "Failed to perform voice conversion";
      sptk::PrintErrorMessage("vc", error_message);
      return 1;
    }
  }

  // Write output vectors.
  {
    const int sequence_length(static_cast<int>(target_vectors.size()));
    for (int t(0); t < sequence_length; ++t) {
      if (!sptk::WriteStream(0, num_target_order + 1, target_vectors[t],
                             &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write target vectors";
        sptk::PrintErrorMessage("vc", error_message);
        return 1;
      }
    }
  }

  return 0;
}